

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O0

void __thiscall
vmips::CFGNode::add_phi(CFGNode *this,shared_ptr<vmips::VirtReg> *x,shared_ptr<vmips::VirtReg> *y)

{
  shared_ptr<vmips::VirtReg> local_40;
  shared_ptr<vmips::Instruction> local_30;
  shared_ptr<vmips::VirtReg> *local_20;
  shared_ptr<vmips::VirtReg> *y_local;
  shared_ptr<vmips::VirtReg> *x_local;
  CFGNode *this_local;
  
  local_20 = y;
  y_local = x;
  x_local = (shared_ptr<vmips::VirtReg> *)this;
  std::make_shared<vmips::phi,std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>>
            (&local_40,x);
  std::shared_ptr<vmips::Instruction>::shared_ptr<vmips::phi,void>
            (&local_30,(shared_ptr<vmips::phi> *)&local_40);
  std::
  vector<std::shared_ptr<vmips::Instruction>,_std::allocator<std::shared_ptr<vmips::Instruction>_>_>
  ::push_back(&this->instructions,&local_30);
  std::shared_ptr<vmips::Instruction>::~shared_ptr(&local_30);
  std::shared_ptr<vmips::phi>::~shared_ptr((shared_ptr<vmips::phi> *)&local_40);
  return;
}

Assistant:

void add_phi(std::shared_ptr<VirtReg> x, std::shared_ptr<VirtReg> y) {
            instructions.push_back(std::make_shared<phi>(std::move(x), std::move(y)));
        }